

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h__Writer.cpp
# Opt level: O1

h__ASDCPWriter * __thiscall ASDCP::h__ASDCPWriter::WriteASDCPFooter(h__ASDCPWriter *this)

{
  ui64_t duration;
  uint uVar1;
  long lVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  MDDEntry *pMVar5;
  long *plVar6;
  long in_RSI;
  int64_t tmp_pos;
  _List_node_base *local_118;
  undefined8 uStack_110;
  undefined1 local_100 [208];
  
  plVar6 = *(long **)(in_RSI + 0x428);
  if (plVar6 != (long *)(in_RSI + 0x428)) {
    uVar1 = *(uint *)(in_RSI + 0x338);
    do {
      *(ulong *)plVar6[2] = (ulong)uVar1;
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)(in_RSI + 0x428));
  }
  lVar2 = *(long *)(in_RSI + 0x318);
  *(ulong *)(lVar2 + 0xf8) = (ulong)*(uint *)(in_RSI + 0x338);
  *(undefined1 *)(lVar2 + 0x100) = 1;
  *(undefined8 *)(in_RSI + 0x5f8) = *(undefined8 *)(*(long *)(in_RSI + 0x2f0) + 0x20);
  duration = in_RSI + 0x10;
  (**(code **)(*(long *)(in_RSI + 0x10) + 0x30))((Result_t *)local_100,duration,&local_118);
  Kumu::Result_t::~Result_t((Result_t *)local_100);
  p_Var3 = local_118;
  p_Var4 = (_List_node_base *)operator_new(0x28);
  p_Var4[1]._M_next = (_List_node_base *)&PTR__IArchive_00224580;
  *(undefined4 *)&p_Var4[1]._M_prev = 0;
  p_Var4[2]._M_next = local_118;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  *(long *)(in_RSI + 0x2f8) = *(long *)(in_RSI + 0x2f8) + 1;
  *(_List_node_base **)(in_RSI + 0xe8) = local_118;
  if (*(Dictionary **)(in_RSI + 8) != (Dictionary *)0x0) {
    pMVar5 = Dictionary::Type(*(Dictionary **)(in_RSI + 8),MDD_OPAtom);
    local_118 = *(_List_node_base **)pMVar5->ul;
    uStack_110 = *(undefined8 *)(pMVar5->ul + 8);
    *(undefined1 *)(in_RSI + 0x120) = 1;
    *(_List_node_base **)(in_RSI + 0x121) = local_118;
    *(undefined8 *)(in_RSI + 0x129) = uStack_110;
    lVar2 = *(long *)(in_RSI + 0x260);
    *(undefined1 *)(lVar2 + 0x138) = 1;
    *(_List_node_base **)(lVar2 + 0x139) = local_118;
    *(undefined8 *)(lVar2 + 0x141) = uStack_110;
    *(undefined1 *)(in_RSI + 0x638) = 1;
    *(_List_node_base **)(in_RSI + 0x639) = local_118;
    *(undefined8 *)(in_RSI + 0x641) = uStack_110;
    std::
    _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
    ::operator=((_Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                 *)(in_RSI + 0x658),
                (_Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                 *)(in_RSI + 0x140));
    *(_List_node_base **)(in_RSI + 0x600) = p_Var3;
    *(_List_node_base **)(in_RSI + 0x5f0) = p_Var3;
    MXF::OPAtomIndexFooter::WriteToFile
              ((OPAtomIndexFooter *)this,(FileWriter *)(in_RSI + 0x568),duration);
    if (-1 < *(int *)&(this->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>)._vptr_TrackFileWriter) {
      MXF::RIP::WriteToFile((RIP *)local_100,(FileWriter *)(in_RSI + 0x268));
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_100);
      Kumu::Result_t::~Result_t((Result_t *)local_100);
    }
    if (-1 < *(int *)&(this->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>)._vptr_TrackFileWriter) {
      Kumu::FileReader::Seek((long)local_100,(SeekPos_t)duration);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_100);
      Kumu::Result_t::~Result_t((Result_t *)local_100);
    }
    if (-1 < *(int *)&(this->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>)._vptr_TrackFileWriter) {
      MXF::OP1aHeader::WriteToFile
                ((OP1aHeader *)local_100,(FileWriter *)(in_RSI + 0x50),(SeekPos_t)duration);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_100);
      Kumu::Result_t::~Result_t((Result_t *)local_100);
    }
    Kumu::FileReader::Close();
    Kumu::Result_t::~Result_t((Result_t *)(local_100 + 0x68));
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/h__Writer.cpp"
                ,0x15e,"Result_t ASDCP::h__ASDCPWriter::WriteASDCPFooter()");
}

Assistant:

Result_t
ASDCP::h__ASDCPWriter::WriteASDCPFooter()
{
  // update all Duration properties
  DurationElementList_t::iterator dli = m_DurationUpdateList.begin();

  for (; dli != m_DurationUpdateList.end(); ++dli )
    {
      **dli = m_FramesWritten;
    }

  m_EssenceDescriptor->ContainerDuration = m_FramesWritten;
  m_FooterPart.PreviousPartition = m_RIP.PairArray.back().ByteOffset;

  Kumu::fpos_t here = m_File.TellPosition();
  m_RIP.PairArray.push_back(RIP::PartitionPair(0, here)); // Last RIP Entry
  m_HeaderPart.FooterPartition = here;

  assert(m_Dict);
  // re-label the header partition, set the footer
  UL OPAtomUL(m_Dict->ul(MDD_OPAtom));
  m_HeaderPart.OperationalPattern = OPAtomUL;
  m_HeaderPart.m_Preface->OperationalPattern = OPAtomUL;
  m_FooterPart.OperationalPattern = OPAtomUL;

  m_FooterPart.EssenceContainers = m_HeaderPart.EssenceContainers;
  m_FooterPart.FooterPartition = here;
  m_FooterPart.ThisPartition = here;

  Result_t result = m_FooterPart.WriteToFile(m_File, m_FramesWritten);

  if ( ASDCP_SUCCESS(result) )
    result = m_RIP.WriteToFile(m_File);

  if ( ASDCP_SUCCESS(result) )
    result = m_File.Seek(0);

  if ( ASDCP_SUCCESS(result) )
    result = m_HeaderPart.WriteToFile(m_File, m_HeaderSize);

  m_File.Close();
  return result;
}